

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprCounter>_>::
ReadColumnSizes<false>
          (NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<ExprCounter>_>
           *this)

{
  int iVar1;
  int iVar2;
  TextReader<fmt::Locale> *in_RDI;
  CStringRef unaff_retaddr;
  int size;
  int i;
  int prev_size;
  ColumnSizeHandler size_handler;
  int num_sizes;
  char *in_stack_ffffffffffffffc8;
  int local_24;
  BasicCStringRef<char> local_18;
  undefined4 in_stack_fffffffffffffff0;
  TextReader<fmt::Locale> *this_00;
  
  iVar2 = *(int *)(in_RDI->super_ReaderBase).start_ + -1;
  this_00 = in_RDI;
  iVar1 = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x108ec8);
  if (iVar1 != iVar2) {
    in_stack_ffffffffffffffc8 = (in_RDI->super_ReaderBase).ptr_;
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,"expected {}");
    TextReader<fmt::Locale>::ReportError<int>
              (this_00,unaff_retaddr,(int *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  }
  TextReader<fmt::Locale>::ReadTillEndOfLine
            ((TextReader<fmt::Locale> *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  NLHandler<mp::NullNLHandler<Expr>,_Expr>::OnColumnSizes
            ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)0x108f19);
  for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
    TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x108f40);
    NLHandler<mp::NullNLHandler<Expr>,_Expr>::ColumnSizeHandler::Add
              ((ColumnSizeHandler *)in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    TextReader<fmt::Locale>::ReadTillEndOfLine
              ((TextReader<fmt::Locale> *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadColumnSizes() {
  int num_sizes = header_.num_vars - 1;
  if (reader_.ReadUInt() != num_sizes)
    reader_.ReportError("expected {}", num_sizes);
  reader_.ReadTillEndOfLine();
  typename Handler::ColumnSizeHandler size_handler = handler_.OnColumnSizes();
  int prev_size = 0;
  for (int i = 0; i < num_sizes; ++i) {
    int size = reader_.ReadUInt();
    if (CUMULATIVE) {
      if (size < prev_size)
        reader_.ReportError("invalid column offset");
      size -= prev_size;
      prev_size += size;
    }
    size_handler.Add(size);
    reader_.ReadTillEndOfLine();
  }
}